

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O0

bool __thiscall HighsRandom::bit(HighsRandom *this)

{
  u64 uVar1;
  HighsRandom *in_RDI;
  
  advance(in_RDI);
  uVar1 = HighsHashHelpers::pair_hash<0>((u32)in_RDI->state,(u32)(in_RDI->state >> 0x20));
  return (long)uVar1 < 0;
}

Assistant:

bool bit() {
    advance();
    return HighsHashHelpers::pair_hash<0>(static_cast<uint32_t>(state),
                                          state >> 32) >>
           63;
  }